

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O1

vorbis_look_residue * res0_look(vorbis_dsp_state *vd,vorbis_info_residue *vr)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *puVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  size_t __nmemb;
  uint local_48;
  
  puVar5 = (undefined8 *)calloc(1,0x50);
  pvVar8 = vd->vi->codec_setup;
  *puVar5 = vr;
  iVar1 = *(int *)((long)vr + 0x14);
  __nmemb = (size_t)iVar1;
  *(int *)(puVar5 + 1) = iVar1;
  lVar15 = *(long *)((long)pvVar8 + 0x1328);
  puVar5[2] = lVar15;
  lVar11 = (long)*(int *)((long)vr + 0x1c) * 0x60;
  puVar5[3] = lVar15 + lVar11;
  uVar16 = *(ulong *)(lVar15 + lVar11);
  pvVar6 = calloc(__nmemb,8);
  puVar5[4] = pvVar6;
  if ((long)__nmemb < 1) {
    uVar4 = 0;
  }
  else {
    sVar14 = 0;
    uVar4 = 0;
    iVar17 = 0;
    do {
      uVar3 = ov_ilog(*(ogg_uint32_t *)((long)vr + sVar14 * 4 + 0x20));
      if (uVar3 != 0) {
        if ((int)uVar4 < (int)uVar3) {
          uVar4 = uVar3;
        }
        pvVar7 = calloc((long)(int)uVar3,8);
        *(void **)((long)pvVar6 + sVar14 * 8) = pvVar7;
        if (0 < (int)uVar3) {
          uVar2 = *(uint *)((long)vr + sVar14 * 4 + 0x20);
          uVar12 = 0;
          do {
            if ((uVar2 >> ((uint)uVar12 & 0x1f) & 1) != 0) {
              lVar15 = (long)iVar17;
              iVar17 = iVar17 + 1;
              *(long *)(*(long *)((long)pvVar6 + sVar14 * 8) + uVar12 * 8) =
                   (long)*(int *)((long)vr + lVar15 * 4 + 0x120) * 0x60 +
                   *(long *)((long)pvVar8 + 0x1328);
            }
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
        }
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != __nmemb);
  }
  *(undefined4 *)(puVar5 + 5) = 1;
  local_48 = (uint)uVar16;
  if (0 < (int)local_48) {
    iVar17 = *(int *)(puVar5 + 5);
    do {
      iVar17 = iVar17 * iVar1;
      uVar3 = (int)uVar16 - 1;
      uVar16 = (ulong)uVar3;
    } while (uVar3 != 0);
    *(int *)(puVar5 + 5) = iVar17;
  }
  *(uint *)((long)puVar5 + 0xc) = uVar4;
  iVar17 = *(int *)(puVar5 + 5);
  lVar15 = (long)iVar17;
  pvVar8 = malloc(lVar15 * 8);
  puVar5[6] = pvVar8;
  if (0 < lVar15) {
    lVar11 = 0;
    do {
      pvVar6 = malloc((long)(int)local_48 * 4);
      *(void **)((long)pvVar8 + lVar11 * 8) = pvVar6;
      if (0 < (int)local_48) {
        uVar16 = 0;
        lVar13 = lVar11;
        lVar10 = (long)(iVar17 / iVar1);
        do {
          lVar9 = lVar13 / lVar10;
          lVar13 = lVar13 % lVar10;
          lVar10 = lVar10 / (long)__nmemb;
          *(int *)((long)pvVar6 + uVar16 * 4) = (int)lVar9;
          uVar16 = uVar16 + 1;
        } while ((local_48 & 0x7fffffff) != uVar16);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar15);
  }
  return puVar5;
}

Assistant:

vorbis_look_residue *res0_look(vorbis_dsp_state *vd,
                               vorbis_info_residue *vr){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  vorbis_look_residue0 *look=_ogg_calloc(1,sizeof(*look));
  codec_setup_info     *ci=vd->vi->codec_setup;

  int j,k,acc=0;
  int dim;
  int maxstage=0;
  look->info=info;

  look->parts=info->partitions;
  look->fullbooks=ci->fullbooks;
  look->phrasebook=ci->fullbooks+info->groupbook;
  dim=look->phrasebook->dim;

  look->partbooks=_ogg_calloc(look->parts,sizeof(*look->partbooks));

  for(j=0;j<look->parts;j++){
    int stages=ov_ilog(info->secondstages[j]);
    if(stages){
      if(stages>maxstage)maxstage=stages;
      look->partbooks[j]=_ogg_calloc(stages,sizeof(*look->partbooks[j]));
      for(k=0;k<stages;k++)
        if(info->secondstages[j]&(1<<k)){
          look->partbooks[j][k]=ci->fullbooks+info->booklist[acc++];
#ifdef TRAIN_RES
          look->training_data[k][j]=_ogg_calloc(look->partbooks[j][k]->entries,
                                           sizeof(***look->training_data));
#endif
        }
    }
  }

  look->partvals=1;
  for(j=0;j<dim;j++)
      look->partvals*=look->parts;

  look->stages=maxstage;
  look->decodemap=_ogg_malloc(look->partvals*sizeof(*look->decodemap));
  for(j=0;j<look->partvals;j++){
    long val=j;
    long mult=look->partvals/look->parts;
    look->decodemap[j]=_ogg_malloc(dim*sizeof(*look->decodemap[j]));
    for(k=0;k<dim;k++){
      long deco=val/mult;
      val-=deco*mult;
      mult/=look->parts;
      look->decodemap[j][k]=deco;
    }
  }
#if defined(TRAIN_RES) || defined (TRAIN_RESAUX)
  {
    static int train_seq=0;
    look->train_seq=train_seq++;
  }
#endif
  return(look);
}